

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_renegotiation_info(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  char *format;
  
  if (ssl->renego_status == 0) {
    if ((len == 1) && (*buf == '\0')) {
      ssl->secure_renegotiation = 1;
      return 0;
    }
    format = "non-zero length renegotiation info";
    iVar4 = 0xad;
  }
  else {
    uVar1 = ssl->verify_data_len;
    if ((uVar1 + 1 == len) && (uVar1 == *buf)) {
      if (uVar1 == 0) {
        return 0;
      }
      bVar3 = 0;
      uVar5 = 0;
      do {
        bVar3 = bVar3 | ssl->peer_verify_data[uVar5] ^ buf[uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      if (bVar3 == 0) {
        return 0;
      }
    }
    format = "non-matching renegotiation info";
    iVar4 = 0xa0;
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,iVar4,format);
  iVar2 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
  iVar4 = -0x7900;
  if (iVar2 != 0) {
    iVar4 = iVar2;
  }
  return iVar4;
}

Assistant:

static int ssl_parse_renegotiation_info( mbedtls_ssl_context *ssl,
                                         const unsigned char *buf,
                                         size_t len )
{
    int ret;

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE )
    {
        /* Check verify-data in constant-time. The length OTOH is no secret */
        if( len    != 1 + ssl->verify_data_len * 2 ||
            buf[0] !=     ssl->verify_data_len * 2 ||
            mbedtls_ssl_safer_memcmp( buf + 1,
                          ssl->own_verify_data, ssl->verify_data_len ) != 0 ||
            mbedtls_ssl_safer_memcmp( buf + 1 + ssl->verify_data_len,
                          ssl->peer_verify_data, ssl->verify_data_len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-matching renegotiation info" ) );

            if( ( ret = mbedtls_ssl_send_fatal_handshake_failure( ssl ) ) != 0 )
                return( ret );

            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else
#endif /* MBEDTLS_SSL_RENEGOTIATION */
    {
        if( len != 1 || buf[0] != 0x00 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-zero length renegotiation info" ) );

            if( ( ret = mbedtls_ssl_send_fatal_handshake_failure( ssl ) ) != 0 )
                return( ret );

            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }

        ssl->secure_renegotiation = MBEDTLS_SSL_SECURE_RENEGOTIATION;
    }

    return( 0 );
}